

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_bcast_(void *buffer,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *root,
                  MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_bcast_();
  return;
}

Assistant:

void mpiabi_bcast_(
  void * buffer,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_bcast_(
    buffer,
    count,
    datatype,
    root,
    comm,
    ierror
  );
}